

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void gen_initializer(c2m_ctx_t c2m_ctx,size_t init_start,op_t var,char *global_name,mir_size_t size,
                    int param_6)

{
  void *els;
  node_code_t nVar1;
  uint uVar2;
  gen_ctx_conflict *pgVar3;
  init_el_t *piVar4;
  type *ptVar5;
  MIR_context_t ctx_00;
  node_t_conflict pnVar6;
  ulong uVar7;
  expr_conflict *to_e;
  decl_t member_decl;
  MIR_context_t ctx_01;
  MIR_module_t module;
  op_t var_00;
  op_t oVar8;
  undefined1 auVar9 [64];
  undefined2 uVar10;
  undefined8 els_00;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined4 uVar13;
  MIR_type_t MVar14;
  MIR_type_t MVar15;
  MIR_alias_t alias;
  op_t *desirable_dest;
  size_t sVar16;
  undefined8 uVar17;
  size_t sVar18;
  VARR_init_el_t *pVVar19;
  MIR_label_t label;
  DLIST_MIR_module_t *pDVar20;
  MIR_item_t_conflict pMVar21;
  type *type;
  mir_llong mVar22;
  long lVar23;
  decl_t member_decl_00;
  ulong unaff_R12;
  ulong uVar24;
  long lVar25;
  MIR_context_t ctx;
  ulong uVar26;
  bool bVar27;
  char buff [50];
  MIR_op_t mem;
  op_t res;
  char *local_1c0;
  MIR_item_t_conflict local_1b8;
  ulong local_170;
  undefined1 local_168 [32];
  anon_union_32_12_57d33f68_for_u aStack_148;
  op_t local_128;
  mir_size_t local_e0;
  MIR_op_t local_d8;
  undefined1 local_a8 [16];
  anon_union_32_12_57d33f68_for_u aStack_98;
  undefined8 local_78;
  undefined8 uStack_70;
  void *pvStack_68;
  undefined8 uStack_60;
  int64_t iStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  MIR_disp_t MStack_40;
  
  pgVar3 = c2m_ctx->gen_ctx;
  if (var.mir_op._8_1_ != '\x01') {
    ctx_00 = c2m_ctx->ctx;
    local_e0 = size;
    if (param_6 == 0) {
      if (var.mir_op._8_1_ != '\b') {
        __assert_fail("var.mir_op.mode == MIR_OP_REF",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2e72,
                      "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                     );
      }
      pVVar19 = pgVar3->init_els;
      if (pVVar19 != (VARR_init_el_t *)0x0) {
        local_1b8 = (MIR_item_t_conflict)0x0;
        uVar26 = 0;
        uVar24 = init_start;
        do {
          if (pVVar19->els_num <= uVar24) {
            if (local_e0 - 1 < uVar26) {
              return;
            }
            pMVar21 = MIR_new_bss(ctx_00,global_name,local_e0 - uVar26);
            if (global_name == (char *)0x0) {
              return;
            }
            ((var.decl)->u).item = pMVar21;
            return;
          }
          piVar4 = pVVar19->varr;
          if (piVar4 == (init_el_t *)0x0) goto LAB_001a8e90;
          uVar7 = piVar4[uVar24].offset;
          member_decl_00 = piVar4[uVar24].member_decl;
          ptVar5 = piVar4[uVar24].el_type;
          pnVar6 = piVar4[uVar24].init;
          if (uVar24 == init_start) {
LAB_001a87d7:
            to_e = (expr_conflict *)pnVar6->attr;
            if ((undefined1  [64])((undefined1  [64])*to_e & (undefined1  [64])0x2) ==
                (undefined1  [64])0x0) {
              if ((undefined1  [64])((undefined1  [64])*to_e & (undefined1  [64])0x1) !=
                  (undefined1  [64])0x0) {
                cast_value(to_e,to_e,ptVar5);
                to_e->type = ptVar5;
              }
              gen((op_t *)local_168,c2m_ctx,pnVar6,(MIR_label_t)0x0,(MIR_label_t)0x0,1,(op_t *)0x0,
                  (int *)0x0);
              if (6 < (ushort)(local_168[0x18] - 3)) goto LAB_001a8ea4;
            }
            local_1c0 = global_name;
            if (uVar26 <= uVar7 && uVar7 - uVar26 != 0) {
              local_1b8 = MIR_new_bss(ctx_00,global_name,uVar7 - uVar26);
              if (global_name != (char *)0x0) {
                ((var.decl)->u).item = local_1b8;
              }
              local_1c0 = (char *)0x0;
            }
            MVar14 = get_mir_type(c2m_ctx,ptVar5);
            oVar8 = _local_168;
            if ((undefined1  [64])((undefined1  [64])*to_e & (undefined1  [64])0x2) ==
                (undefined1  [64])0x0) {
              uVar10 = local_168._24_2_;
              if (local_168[0x18] == '\t') {
                if (ptVar5->mode != TM_ARR) {
                  ctx_01 = c2m_ctx->ctx;
                  pDVar20 = MIR_get_module_list(ctx_01);
                  module = pDVar20->tail;
                  _MIR_get_temp_item_name(ctx_01,module,(char *)&local_128,0x32);
                  pMVar21 = MIR_new_string_data(ctx_01,(char *)&local_128,oVar8.mir_op.u._0_16_);
                  move_item_to_module_start(module,pMVar21);
                  local_1b8 = MIR_new_ref_data(ctx_00,local_1c0,pMVar21,0);
                  goto LAB_001a8c78;
                }
                sVar16 = raw_type_size(c2m_ctx,ptVar5);
                uVar17 = aStack_148.i;
                els_00 = aStack_148.str.s;
                if (sVar16 < (ulong)uVar17) {
                  local_1b8 = MIR_new_data(ctx_00,local_1c0,MIR_T_U8,sVar16,(void *)els_00);
                }
                else {
                  local_1b8 = MIR_new_string_data(ctx_00,local_1c0,aStack_148.str);
                  if ((ulong)uVar17 <= sVar16 && sVar16 - uVar17 != 0) {
                    MIR_new_bss(ctx_00,(char *)0x0,sVar16 - uVar17);
                  }
                }
              }
              else {
                if (local_168[0x18] == '\b') {
                  mVar22 = 0;
                  uVar17 = aStack_148.i;
                  goto LAB_001a8c6b;
                }
                sVar18 = _MIR_type_size(ctx_00,MVar14);
                sVar16 = sVar18;
                if (member_decl_00 == (decl_t)0x0) {
                  uVar26 = 0;
                }
                else {
                  uVar2 = member_decl_00->bit_offset;
                  if ((int)uVar2 < 0) {
                    uVar26 = 0;
                  }
                  else {
                    local_d8.data = (void *)0x0;
                    if (1 < (ushort)((uVar10 & 0xff) - 3)) {
                      __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                    ,0x2eb7,
                                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                                   );
                    }
                    if ((uVar2 & 7) != 0) goto LAB_001a8f0e;
                    add_bit_field(c2m_ctx,(uint64_t *)&local_d8,aStack_148.u,member_decl_00);
                    pVVar19 = pgVar3->init_els;
                    if (pVVar19 == (VARR_init_el_t *)0x0) goto LAB_001a8e9a;
                    bVar27 = uVar24 + 1 < pVVar19->els_num;
                    if (bVar27) {
                      lVar23 = uVar24 * 0x38 + 0x68;
                      uVar26 = uVar24;
                      do {
                        piVar4 = pVVar19->varr;
                        if (piVar4 == (init_el_t *)0x0) goto LAB_001a8e9f;
                        local_170 = *(ulong *)((long)piVar4 + lVar23 + -0x20);
                        uVar24 = uVar26;
                        if (local_170 != uVar7) break;
                        member_decl = *(decl_t *)((long)piVar4 + lVar23 + -0x18);
                        if (member_decl->bit_offset != member_decl_00->bit_offset) {
                          gen(&local_128,c2m_ctx,
                              *(node_t_conflict *)((long)&piVar4->c2m_ctx + lVar23),(MIR_label_t)0x0
                              ,(MIR_label_t)0x0,1,(op_t *)0x0,(int *)0x0);
                          oVar8.decl._1_1_ = local_128.decl._1_1_;
                          oVar8.decl._0_1_ = local_128.decl._0_1_;
                          oVar8.decl._2_2_ = local_128.decl._2_2_;
                          oVar8.decl._4_4_ = local_128.decl._4_4_;
                          oVar8._8_2_ = local_128._8_2_;
                          oVar8._10_6_ = local_128._10_6_;
                          oVar8.mir_op.data = local_128.mir_op.data;
                          oVar8.mir_op._8_8_ = local_128.mir_op._8_8_;
                          oVar8.mir_op.u.u = local_128.mir_op.u.i;
                          oVar8.mir_op.u.str.s = local_128.mir_op.u.str.s;
                          oVar8.mir_op.u._16_8_ = local_128.mir_op.u._16_8_;
                          oVar8.mir_op.u.mem.disp = local_128.mir_op.u.mem.disp;
                          local_168[0x18] = local_128.mir_op._8_1_;
                          _local_168 = oVar8;
                          if (1 < (ushort)(local_168[0x18] - 3)) {
                            __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                          ,0x2ec0,
                                          "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                                         );
                          }
                          add_bit_field(c2m_ctx,(uint64_t *)&local_d8,local_128.mir_op.u.u,
                                        member_decl);
                          pVVar19 = pgVar3->init_els;
                        }
                        if (pVVar19 == (VARR_init_el_t *)0x0) goto LAB_001a8e9a;
                        uVar24 = uVar26 + 1;
                        lVar23 = lVar23 + 0x38;
                        bVar27 = uVar26 + 2 < pVVar19->els_num;
                        local_170 = uVar7;
                        member_decl_00 = member_decl;
                        uVar26 = uVar24;
                      } while (bVar27);
                    }
                    uVar26 = (ulong)(uVar2 >> 3);
                    aStack_148.i = (int64_t)local_d8.data;
                    sVar16 = local_170 - uVar7;
                    if (sVar18 <= local_170 - uVar7) {
                      sVar16 = sVar18;
                    }
                    if (!bVar27) {
                      sVar16 = sVar18;
                    }
                  }
                }
                uVar13 = local_128.decl._4_4_;
                uVar10 = local_128.decl._2_2_;
                uVar12 = local_128.decl._1_1_;
                uVar11 = local_128.decl._0_1_;
                local_128.decl._0_1_ = local_168[0x20];
                local_128.decl._1_1_ = local_168[0x21];
                local_128.decl._2_2_ = local_168._34_2_;
                local_128.decl._4_4_ = local_168._36_4_;
                switch(MVar14) {
                case MIR_T_I8:
                case MIR_T_U8:
                  local_128.decl._1_1_ = uVar12;
                  local_128.decl._2_2_ = uVar10;
                  local_128.decl._4_4_ = uVar13;
                  break;
                case MIR_T_I16:
                case MIR_T_U16:
                  local_128.decl._2_2_ = uVar10;
                  local_128.decl._4_4_ = uVar13;
                  break;
                case MIR_T_I32:
                case MIR_T_U32:
                  local_128.decl._4_4_ = uVar13;
                  break;
                case MIR_T_I64:
                case MIR_T_U64:
                  break;
                case MIR_T_F:
                  local_128.decl._4_4_ = uVar13;
                  break;
                case MIR_T_D:
                  break;
                case MIR_T_LD:
                  local_128._8_2_ = local_168._40_2_;
                  break;
                default:
                  local_128.decl._0_1_ = uVar11;
                  local_128.decl._1_1_ = uVar12;
                  local_128.decl._2_2_ = uVar10;
                  local_128.decl._4_4_ = uVar13;
                  __assert_fail("FALSE",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x2ed4,
                                "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                               );
                }
                if ((uVar26 == 0) && (sVar16 == sVar18)) {
                  local_1b8 = MIR_new_data(ctx_00,local_1c0,MVar14,1,&local_128);
                }
                else if (uVar26 < sVar16) {
                  els = (void *)((long)&local_128.decl + uVar26);
                  lVar23 = 0;
                  do {
                    if (lVar23 == 0) {
                      local_1b8 = MIR_new_data(ctx_00,local_1c0,MIR_T_U8,1,els);
                    }
                    else {
                      MIR_new_data(ctx_00,(char *)0x0,MIR_T_U8,1,(void *)((long)els + lVar23));
                    }
                    lVar23 = lVar23 + 1;
                  } while (sVar16 - uVar26 != lVar23);
                }
              }
            }
            else {
              pnVar6 = to_e->def_node;
              if (pnVar6 == (node_t_conflict)0x0) {
                mVar22 = (to_e->c).i_val;
                local_128.decl._0_1_ = (undefined1)mVar22;
                local_128.decl._1_1_ = (undefined1)((ulong)mVar22 >> 8);
                local_128.decl._2_2_ = (undefined2)((ulong)mVar22 >> 0x10);
                local_128.decl._4_4_ = (undefined4)((ulong)mVar22 >> 0x20);
                local_1b8 = MIR_new_data(ctx_00,local_1c0,MIR_T_P,1,&local_128);
                MVar14 = MIR_T_P;
              }
              else {
                if (pnVar6->code - N_STR < 3) {
                  uVar17 = get_string_data((c2m_ctx_t)c2m_ctx->ctx,pnVar6);
                }
                else {
                  if (pnVar6->code == N_LABEL_ADDR) {
                    label = get_label(c2m_ctx,*(node_t_conflict *)
                                               (*(long *)((long)pnVar6->attr + 8) + 0x20));
                    local_1b8 = MIR_new_lref_data(ctx_00,local_1c0,label,(MIR_label_t)0x0,
                                                  (to_e->c).i_val);
                    goto LAB_001a8c78;
                  }
                  uVar17 = *(undefined8 *)((long)pnVar6->attr + 0x50);
                }
                mVar22 = (to_e->c).i_val;
LAB_001a8c6b:
                local_1b8 = MIR_new_ref_data(ctx_00,local_1c0,(MIR_item_t_conflict)uVar17,mVar22);
              }
LAB_001a8c78:
              sVar16 = _MIR_type_size(ctx_00,MVar14);
            }
            if (local_1c0 != (char *)0x0) {
              ((var.decl)->u).item = local_1b8;
            }
            uVar26 = sVar16 + uVar7;
            global_name = (char *)0x0;
            pVVar19 = pgVar3->init_els;
          }
          else {
            if (pVVar19->els_num <= uVar24 - 1) goto LAB_001a8e95;
            if ((uVar7 != piVar4[uVar24 - 1].offset) ||
               ((member_decl_00 != (decl_t)0x0 && (-1 < member_decl_00->bit_offset))))
            goto LAB_001a87d7;
          }
          uVar24 = uVar24 + 1;
        } while (pVVar19 != (VARR_init_el_t *)0x0);
      }
LAB_001a8e8b:
      gen_initializer_cold_7();
LAB_001a8e90:
      gen_initializer_cold_6();
LAB_001a8e95:
      gen_initializer_cold_3();
LAB_001a8e9a:
      gen_initializer_cold_5();
LAB_001a8e9f:
      gen_initializer_cold_4();
LAB_001a8ea4:
      __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT || val.mir_op.mode == MIR_OP_FLOAT || val.mir_op.mode == MIR_OP_DOUBLE || val.mir_op.mode == MIR_OP_LDOUBLE || val.mir_op.mode == MIR_OP_STR || val.mir_op.mode == MIR_OP_REF"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2e82,
                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
    }
    if ((var.mir_op._8_1_ != '\n') || (var.mir_op.u.mem.index != 0)) {
      __assert_fail("var.mir_op.mode == MIR_OP_MEM && var.mir_op.u.mem.index == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2e4b,
                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
    }
    pVVar19 = pgVar3->init_els;
    uVar13 = (MIR_reg_t)local_1c0;
    if (pVVar19 != (VARR_init_el_t *)0x0) {
      lVar25 = 0;
      unaff_R12 = 0;
      local_1b8 = (MIR_item_t_conflict)var.mir_op.u.mem.disp;
      lVar23 = init_start * 0x38 + 0x30;
      do {
        if (pVVar19->els_num <= init_start + lVar25) goto LAB_001a8705;
        piVar4 = pVVar19->varr;
        if (piVar4 == (init_el_t *)0x0) {
          gen_initializer_cold_1();
          goto LAB_001a8e8b;
        }
        uVar17 = *(undefined8 *)((long)piVar4 + lVar23 + -0x18);
        ptVar5 = *(type **)((long)piVar4 + lVar23 + -0x10);
        type = *(type **)((long)piVar4 + lVar23 + -8);
        uVar24 = *(ulong *)((long)piVar4 + lVar23 + -0x20);
        pnVar6 = *(node_t_conflict *)((long)&piVar4->c2m_ctx + lVar23);
        MVar14 = get_mir_type(c2m_ctx,ptVar5);
        if (unaff_R12 <= uVar24 && uVar24 - unaff_R12 != 0) {
          gen_memset(c2m_ctx,unaff_R12 + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,
                     uVar24 - unaff_R12);
          unaff_R12 = uVar24;
        }
        if (MVar14 == MIR_T_UNDEF) {
          MIR_new_mem_op((MIR_op_t *)local_a8,ctx_00,MIR_T_UNDEF,unaff_R12 + var.mir_op.u.mem.disp,
                         var.mir_op.u.mem.base,0,'\x01');
          local_168 = local_168._8_32_ << 0x40;
          local_128.mir_op.u._8_8_ = aStack_98._16_8_;
          local_128.mir_op.u._16_8_ = aStack_98.mem.disp;
          local_128._8_2_ = SUB82(local_a8._0_8_,0);
          local_128._10_6_ = SUB86(local_a8._0_8_,2);
          local_128.mir_op.data = (void *)local_a8._8_8_;
          local_128.mir_op._8_8_ = aStack_98.i;
          local_128.mir_op.u.i = aStack_98._8_8_;
          auVar9[1] = local_128.decl._1_1_;
          auVar9[0] = local_128.decl._0_1_;
          auVar9._2_2_ = local_128.decl._2_2_;
          auVar9._4_4_ = local_128.decl._4_4_;
          aStack_148.i = aStack_98.i;
          aStack_148.str.s = aStack_98.str.s;
          aStack_148._16_8_ = aStack_98._16_8_;
          aStack_148.mem.disp = aStack_98.mem.disp;
          auVar9._8_8_ = local_a8._0_8_;
          auVar9._16_8_ = local_a8._8_8_;
          auVar9._24_8_ = aStack_98.i;
          auVar9._32_24_ = aStack_148._8_24_;
          auVar9._56_8_ = 0;
          _local_168 = (op_t)(auVar9 << 0x40);
        }
        desirable_dest = (op_t *)local_168;
        if (MVar14 != MIR_T_UNDEF) {
          desirable_dest = (op_t *)0x0;
        }
        gen(&local_128,c2m_ctx,pnVar6,(MIR_label_t)0x0,(MIR_label_t)0x0,
            (uint)(MVar14 != MIR_T_UNDEF),desirable_dest,(int *)0x0);
        local_168[1] = local_128.decl._1_1_;
        local_168[0] = local_128.decl._0_1_;
        local_168._2_2_ = local_128.decl._2_2_;
        local_168._4_4_ = local_128.decl._4_4_;
        local_168._10_6_ = local_128._10_6_;
        local_168._8_2_ = local_128._8_2_;
        local_168._16_8_ = local_128.mir_op.data;
        local_168._24_8_ = local_128.mir_op._8_8_;
        aStack_148.i = local_128.mir_op.u.i;
        aStack_148.str.s = local_128.mir_op.u.str.s;
        aStack_148._16_8_ = local_128.mir_op.u._16_8_;
        aStack_148.mem.disp = local_128.mir_op.u.mem.disp;
        if ((ptVar5->mode - TM_ENUM < 2) ||
           ((ptVar5->mode == TM_BASIC && ((ptVar5->u).basic_type - TP_BOOL < 0xf)))) {
          if ((type == (type *)0x0) || (type->mode != TM_UNION)) {
            type = ptVar5;
          }
          alias = get_type_alias(c2m_ctx,type);
          MIR_new_alias_mem_op
                    (&local_d8,ctx_00,MVar14,uVar24 + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,0,
                     '\x01',alias,0);
          MVar15 = get_mir_type(c2m_ctx,ptVar5);
          cast(&local_128,c2m_ctx,_local_168,MVar15,0);
          local_168[1] = local_128.decl._1_1_;
          local_168[0] = local_128.decl._0_1_;
          local_168._2_2_ = local_128.decl._2_2_;
          local_168._4_4_ = local_128.decl._4_4_;
          local_168._10_6_ = local_128._10_6_;
          local_168._8_2_ = local_128._8_2_;
          uStack_48 = local_d8.u._16_8_;
          MStack_40 = local_d8.u.mem.disp;
          pvStack_68 = local_d8.data;
          uStack_60 = local_d8._8_8_;
          iStack_58 = local_d8.u.i;
          pcStack_50 = local_d8.u.str.s;
          local_168._16_8_ = local_128.mir_op.data;
          local_168._24_8_ = local_128.mir_op._8_8_;
          aStack_148.i = local_128.mir_op.u.i;
          aStack_148.str.s = local_128.mir_op.u.str.s;
          aStack_148._16_8_ = local_128.mir_op.u._16_8_;
          aStack_148.mem.disp = local_128.mir_op.u.mem.disp;
          var_00._8_4_ = (int)uStack_70;
          var_00.decl = (decl_t)uVar17;
          var_00._12_4_ = (int)((ulong)uStack_70 >> 0x20);
          var_00.mir_op.data._0_4_ = (int)local_d8.data;
          var_00.mir_op.data._4_4_ = (int)((ulong)local_d8.data >> 0x20);
          var_00.mir_op._8_8_ = local_d8._8_8_;
          var_00.mir_op.u.i = local_d8.u.i;
          var_00.mir_op.u.str.s = local_d8.u.str.s;
          var_00.mir_op.u._16_8_ = local_d8.u._16_8_;
          var_00.mir_op.u.mem.disp = local_d8.u.mem.disp;
          local_78 = uVar17;
          emit_scalar_assign(c2m_ctx,var_00,(op_t *)local_168,MVar14,
                             (uint)(unaff_R12 == uVar24 || lVar25 == 0));
          sVar16 = _MIR_type_size(ctx_00,MVar14);
        }
        else {
          nVar1 = pnVar6->code;
          if (nVar1 == N_STR32) {
            sVar16 = (pnVar6->u).s.len >> 2;
          }
          else if (nVar1 == N_STR16) {
            sVar16 = (pnVar6->u).s.len >> 1;
          }
          else if (nVar1 == N_STR) {
            sVar16 = (pnVar6->u).s.len;
          }
          else {
            sVar16 = raw_type_size(c2m_ctx,ptVar5);
          }
          gen_memcpy(c2m_ctx,unaff_R12 + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,_local_168,
                     sVar16);
        }
        unaff_R12 = sVar16 + uVar24;
        lVar25 = lVar25 + 1;
        lVar23 = lVar23 + 0x38;
        pVVar19 = pgVar3->init_els;
        uVar13 = var.mir_op.u.mem.base;
      } while (pVVar19 != (VARR_init_el_t *)0x0);
    }
    var.mir_op.u.mem.base = uVar13;
    gen_initializer_cold_2();
LAB_001a8705:
    if (unaff_R12 <= local_e0 && local_e0 - unaff_R12 != 0) {
      gen_memset(c2m_ctx,unaff_R12 + (long)local_1b8,var.mir_op.u.mem.base,local_e0 - unaff_R12);
    }
    return;
  }
  if (param_6 != 0) {
    pVVar19 = pgVar3->init_els;
    if (pVVar19 == (VARR_init_el_t *)0x0) {
      gen_initializer_cold_9();
    }
    else {
      if (pVVar19->els_num - init_start != 1) goto LAB_001a8ee5;
      if ((init_start < pVVar19->els_num) && (piVar4 = pVVar19->varr, piVar4 != (init_el_t *)0x0)) {
        ptVar5 = piVar4[init_start].el_type;
        gen((op_t *)local_168,c2m_ctx,piVar4[init_start].init,(MIR_label_t)0x0,(MIR_label_t)0x0,1,
            (op_t *)0x0,(int *)0x0);
        MVar14 = get_op_type(c2m_ctx,var);
        MVar15 = get_mir_type(c2m_ctx,ptVar5);
        cast(&local_128,c2m_ctx,_local_168,MVar15,0);
        emit_scalar_assign(c2m_ctx,var,(op_t *)local_168,MVar14,0);
        return;
      }
    }
    gen_initializer_cold_8();
LAB_001a8f0e:
    __assert_fail("init_el.member_decl->bit_offset % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2eb8,
                  "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
  }
LAB_001a8ee5:
  __assert_fail("local_p && offset == 0 && VARR_LENGTH (init_el_t, init_els) - init_start == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2e44,
                "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
}

Assistant:

static void gen_initializer (c2m_ctx_t c2m_ctx, size_t init_start, op_t var,
                             const char *global_name, mir_size_t size, int local_p) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t val;
  size_t str_len;
  mir_size_t data_size, el_size, offset = 0, rel_offset = 0, start_offset;
  init_el_t init_el, next_init_el;
  MIR_reg_t base;
  MIR_type_t t;
  MIR_item_t data = NULL; /* to remove a warning */
  struct expr *e;

  if (var.mir_op.mode == MIR_OP_REG) { /* scalar initialization: */
    assert (local_p && offset == 0 && VARR_LENGTH (init_el_t, init_els) - init_start == 1);
    init_el = VARR_GET (init_el_t, init_els, init_start);
    val = val_gen (c2m_ctx, init_el.init);
    t = get_op_type (c2m_ctx, var);
    val = cast (c2m_ctx, val, get_mir_type (c2m_ctx, init_el.el_type), FALSE);
    emit_scalar_assign (c2m_ctx, var, &val, t, FALSE);
  } else if (local_p) { /* local variable initialization: */
    assert (var.mir_op.mode == MIR_OP_MEM && var.mir_op.u.mem.index == 0); /*???*/
    offset = var.mir_op.u.mem.disp;
    base = var.mir_op.u.mem.base;
    for (size_t i = init_start; i < VARR_LENGTH (init_el_t, init_els); i++) {
      init_el = VARR_GET (init_el_t, init_els, i);
      t = get_mir_type (c2m_ctx, init_el.el_type);
      if (rel_offset < init_el.offset) { /* fill the gap: */
        gen_memset (c2m_ctx, offset + rel_offset, base, init_el.offset - rel_offset);
        rel_offset = init_el.offset;
      }
      if (t == MIR_T_UNDEF)
        val = new_op (NULL, MIR_new_mem_op (ctx, t, offset + rel_offset, base, 0, 1));
      val = gen (c2m_ctx, init_el.init, NULL, NULL, t != MIR_T_UNDEF,
                 t != MIR_T_UNDEF ? NULL : &val, NULL);
      if (!scalar_type_p (init_el.el_type)) {
        mir_size_t s = init_el.init->code == N_STR     ? init_el.init->u.s.len
                       : init_el.init->code == N_STR16 ? init_el.init->u.s.len / 2
                       : init_el.init->code == N_STR32 ? init_el.init->u.s.len / 4
                                                       : raw_type_size (c2m_ctx, init_el.el_type);
        gen_memcpy (c2m_ctx, offset + rel_offset, base, val, s);
        rel_offset = init_el.offset + s;
      } else {
        MIR_op_t mem
          = MIR_new_alias_mem_op (ctx, t, offset + init_el.offset, base, 0, 1,
                                  get_type_alias (c2m_ctx,
                                                  init_el.container_type != NULL
                                                      && init_el.container_type->mode == TM_UNION
                                                    ? init_el.container_type
                                                    : init_el.el_type),
                                  0);
        val = cast (c2m_ctx, val, get_mir_type (c2m_ctx, init_el.el_type), FALSE);
        emit_scalar_assign (c2m_ctx, new_op (init_el.member_decl, mem), &val, t,
                            i == init_start || rel_offset == init_el.offset);
        rel_offset = init_el.offset + _MIR_type_size (ctx, t);
      }
    }
    if (rel_offset < size) /* fill the tail: */
      gen_memset (c2m_ctx, offset + rel_offset, base, size - rel_offset);
  } else {
    assert (var.mir_op.mode == MIR_OP_REF);
    for (size_t i = init_start; i < VARR_LENGTH (init_el_t, init_els); i++) {
      init_el = VARR_GET (init_el_t, init_els, i);
      if (i != init_start && init_el.offset == VARR_GET (init_el_t, init_els, i - 1).offset
          && (init_el.member_decl == NULL || init_el.member_decl->bit_offset < 0))
        continue;
      e = init_el.init->attr;
      if (!e->const_addr_p) {
        if (e->const_p) {
          convert_value (e, init_el.el_type);
          e->type = init_el.el_type; /* to get the right value in the subsequent gen call */
        }
        val = val_gen (c2m_ctx, init_el.init);
        assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT
                || val.mir_op.mode == MIR_OP_FLOAT || val.mir_op.mode == MIR_OP_DOUBLE
                || val.mir_op.mode == MIR_OP_LDOUBLE || val.mir_op.mode == MIR_OP_STR
                || val.mir_op.mode == MIR_OP_REF);
      }
      if (rel_offset < init_el.offset) { /* fill the gap: */
        data = MIR_new_bss (ctx, global_name, init_el.offset - rel_offset);
        if (global_name != NULL) var.decl->u.item = data;
        global_name = NULL;
      }
      t = get_mir_type (c2m_ctx, init_el.el_type);
      if (e->const_addr_p) {
        node_t def;

        if ((def = e->def_node) == NULL) { /* constant address */
          mir_size_t s = e->c.i_val;
          data = MIR_new_data (ctx, global_name, MIR_T_P, 1, &s);
          data_size = _MIR_type_size (ctx, MIR_T_P);
        } else if (def->code == N_LABEL_ADDR) {
          data = MIR_new_lref_data (ctx, global_name,
                                    get_label (c2m_ctx,
                                               ((struct expr *) def->attr)->u.label_addr_target),
                                    NULL, e->c.i_val);
          data_size = _MIR_type_size (ctx, t);
        } else {
          if (def->code != N_STR && def->code != N_STR16 && def->code != N_STR32) {
            data = ((decl_t) def->attr)->u.item;
          } else {
            data = get_string_data (c2m_ctx, def);
          }
          data = MIR_new_ref_data (ctx, global_name, data, e->c.i_val);
          data_size = _MIR_type_size (ctx, t);
        }
      } else if (val.mir_op.mode == MIR_OP_REF) {
        data = MIR_new_ref_data (ctx, global_name, val.mir_op.u.ref, 0);
        data_size = _MIR_type_size (ctx, t);
      } else if (val.mir_op.mode != MIR_OP_STR) {
        union {
          int8_t i8;
          uint8_t u8;
          int16_t i16;
          uint16_t u16;
          int32_t i32;
          uint32_t u32;
          int64_t i64;
          uint64_t u64;
          float f;
          double d;
          long double ld;
          uint8_t data[8];
        } u;
        start_offset = 0;
        el_size = data_size = _MIR_type_size (ctx, t);
        if (init_el.member_decl != NULL && init_el.member_decl->bit_offset >= 0) {
          uint64_t uval = 0;

          assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT);
          assert (init_el.member_decl->bit_offset % 8 == 0); /* first in the group of bitfields */
          start_offset = init_el.member_decl->bit_offset / 8;
          add_bit_field (c2m_ctx, &uval, val.mir_op.u.u, init_el.member_decl);
          for (; i + 1 < VARR_LENGTH (init_el_t, init_els); i++, init_el = next_init_el) {
            next_init_el = VARR_GET (init_el_t, init_els, i + 1);
            if (next_init_el.offset != init_el.offset) break;
            if (next_init_el.member_decl->bit_offset == init_el.member_decl->bit_offset) continue;
            val = val_gen (c2m_ctx, next_init_el.init);
            assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT);
            add_bit_field (c2m_ctx, &uval, val.mir_op.u.u, next_init_el.member_decl);
          }
          val.mir_op.u.u = uval;
          if (i + 1 < VARR_LENGTH (init_el_t, init_els)
              && next_init_el.offset - init_el.offset < data_size)
            data_size = next_init_el.offset - init_el.offset;
        }
        switch (t) {
        case MIR_T_I8: u.i8 = (int8_t) val.mir_op.u.i; break;
        case MIR_T_U8: u.u8 = (uint8_t) val.mir_op.u.u; break;
        case MIR_T_I16: u.i16 = (int16_t) val.mir_op.u.i; break;
        case MIR_T_U16: u.u16 = (uint16_t) val.mir_op.u.u; break;
        case MIR_T_I32: u.i32 = (int32_t) val.mir_op.u.i; break;
        case MIR_T_U32: u.u32 = (uint32_t) val.mir_op.u.u; break;
        case MIR_T_I64: u.i64 = val.mir_op.u.i; break;
        case MIR_T_U64: u.u64 = val.mir_op.u.u; break;
        case MIR_T_F: u.f = val.mir_op.u.f; break;
        case MIR_T_D: u.d = val.mir_op.u.d; break;
        case MIR_T_LD: u.ld = val.mir_op.u.ld; break;
        default: assert (FALSE);
        }
        if (start_offset == 0 && data_size == el_size) {
          data = MIR_new_data (ctx, global_name, t, 1, &u);
        } else {
          for (mir_size_t byte_num = start_offset; byte_num < data_size; byte_num++) {
            if (byte_num == start_offset)
              data = MIR_new_data (ctx, global_name, MIR_T_U8, 1, &u.data[byte_num]);
            else
              MIR_new_data (ctx, NULL, MIR_T_U8, 1, &u.data[byte_num]);
          }
        }
      } else if (init_el.el_type->mode == TM_ARR) {
        data_size = raw_type_size (c2m_ctx, init_el.el_type);
        str_len = val.mir_op.u.str.len;
        if (data_size < str_len) {
          data = MIR_new_data (ctx, global_name, MIR_T_U8, data_size, val.mir_op.u.str.s);
        } else {
          data = MIR_new_string_data (ctx, global_name, val.mir_op.u.str);
          if (data_size > str_len) MIR_new_bss (ctx, NULL, data_size - str_len);
        }
      } else {
        data = get_mir_str_op_data (c2m_ctx, val.mir_op.u.str);
        data = MIR_new_ref_data (ctx, global_name, data, 0);
        data_size = _MIR_type_size (ctx, t);
      }
      if (global_name != NULL) var.decl->u.item = data;
      global_name = NULL;
      rel_offset = init_el.offset + data_size;
    }
    if (rel_offset < size || size == 0) { /* fill the tail: */
      data = MIR_new_bss (ctx, global_name, size - rel_offset);
      if (global_name != NULL) var.decl->u.item = data;
    }
  }
}